

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void minMaxFinalize(sqlite3_context *context)

{
  Mem *pValue;
  
  pValue = (Mem *)sqlite3_aggregate_context(context,0);
  if (pValue != (Mem *)0x0) {
    if (pValue->flags != 0) {
      sqlite3_result_value(context,pValue);
    }
    sqlite3VdbeMemRelease(pValue);
    return;
  }
  return;
}

Assistant:

static void minMaxFinalize(sqlite3_context *context){
  sqlite3_value *pRes;
  pRes = (sqlite3_value *)sqlite3_aggregate_context(context, 0);
  if( pRes ){
    if( pRes->flags ){
      sqlite3_result_value(context, pRes);
    }
    sqlite3VdbeMemRelease(pRes);
  }
}